

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_resource_manager.cpp
# Opt level: O1

pair<CS248::internal::GLIntId<CS248::internal::TextureArrayTag>,_CS248::internal::GLIntId<CS248::internal::TextureArrayTag>_>
 __thiscall
CS248::GLResourceManager::createDepthAndColorTextureArrayFromFrameBuffers
          (GLResourceManager *this,FrameBufferId *fbids,int num,int texture_size)

{
  GLuint GVar1;
  GLuint GVar2;
  TextureArrayId TVar3;
  undefined8 uVar4;
  ulong uVar5;
  pair<CS248::internal::GLIntId<CS248::internal::TextureArrayTag>,_CS248::internal::GLIntId<CS248::internal::TextureArrayTag>_>
  pVar6;
  GLuint id;
  undefined4 uStack_3c;
  FrameBufferId *local_38;
  
  TVar3.id = (GLuint)&id;
  local_38 = fbids;
  glGenTextures(1);
  GVar1 = id;
  bindTextureArray((GLResourceManager *)&id,TVar3);
  (*__glewTexImage3D)(0x8c1a,0,0x1902,texture_size,texture_size,num,0,0x1902,0x1406,(void *)0x0);
  glTexParameteri(0x8c1a,0x2800,0x2600);
  glTexParameteri(0x8c1a,0x2801,0x2600);
  glTexParameteri(0x8c1a,0x2802,0x812f);
  glTexParameteri(0x8c1a,0x2803,0x812f);
  if ((long *)CONCAT44(uStack_3c,id) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(uStack_3c,id) + 8))();
  }
  TVar3.id = (GLuint)&id;
  glGenTextures(1);
  GVar2 = id;
  bindTextureArray((GLResourceManager *)&id,TVar3);
  (*__glewTexImage3D)(0x8c1a,0,0x1907,texture_size,texture_size,num,0,0x1908,0x1401,(void *)0x0);
  glTexParameteri(0x8c1a,0x2800,0x2600);
  glTexParameteri(0x8c1a,0x2801,0x2600);
  glTexParameteri(0x8c1a,0x2802,0x812f);
  uVar4 = 0x2803;
  glTexParameteri(0x8c1a,0x2803,0x812f);
  if ((long *)CONCAT44(uStack_3c,id) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(uStack_3c,id) + 8))();
  }
  if (0 < num) {
    uVar5 = 0;
    do {
      bindFrameBuffer((GLResourceManager *)&id,(FrameBufferId)(GLuint)uVar4);
      (*__glewFramebufferTextureLayer)(0x8d40,0x8d00,GVar1,0,(GLint)uVar5);
      uVar4 = 0x8ce0;
      (*__glewFramebufferTextureLayer)(0x8d40,0x8ce0,GVar2,0,(GLint)uVar5);
      if ((long *)CONCAT44(uStack_3c,id) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(uStack_3c,id) + 8))();
      }
      uVar5 = uVar5 + 1;
    } while ((uint)num != uVar5);
  }
  pVar6.second.id = GVar2;
  pVar6.first.id = GVar1;
  return pVar6;
}

Assistant:

std::pair<TextureArrayId, TextureArrayId> GLResourceManager::createDepthAndColorTextureArrayFromFrameBuffers(const FrameBufferId* fbids, int num, int texture_size) {
  // Texture Array is just one texture
  TextureArrayId depth_id{createTexture().id};
  {
    auto tex_bind = bindTextureArray(depth_id);
    glTexImage3D(GL_TEXTURE_2D_ARRAY, /*level=*/0, GL_DEPTH_COMPONENT, /*width=*/texture_size,
        /*height=*/texture_size, /*depth=*/num, /*border=*/0, GL_DEPTH_COMPONENT, GL_FLOAT, /*data=*/0);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE); 
  }
  TextureArrayId color_id{createTexture().id};
  {
    auto tex_bind = bindTextureArray(color_id);
    glTexImage3D(GL_TEXTURE_2D_ARRAY, /*level=*/0, GL_RGB, /*width=*/texture_size,
        /*height=*/texture_size, /*depth=*/num, /*border=*/0, GL_RGBA, GL_UNSIGNED_BYTE, /*data=*/0);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE); 
  }
  for (int i = 0; i < num; ++i) {
    auto fb_bind = bindFrameBuffer(fbids[i]);
    glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, depth_id.id, /*level=*/0, /*layer=*/i);
    glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, color_id.id, /*level=*/0, /*layer=*/i);
  }
  return std::make_pair(depth_id, color_id);
}